

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t helper_macmulf_m68k(CPUM68KState_conflict *env,uint32_t op1,uint32_t op2)

{
  uint uVar1;
  ulong uStack_20;
  uint32_t remainder;
  uint64_t product;
  uint32_t op2_local;
  uint32_t op1_local;
  CPUM68KState_conflict *env_local;
  
  uStack_20 = (ulong)op1 * (ulong)op2;
  if ((env->macsr & 0x10) == 0) {
    uStack_20 = uStack_20 >> 0x18;
  }
  else {
    uVar1 = (uint)uStack_20 & 0xffffff;
    uStack_20 = uStack_20 >> 0x18;
    if (uVar1 < 0x800001) {
      if (uVar1 == 0x800000) {
        uStack_20 = (uStack_20 & 1) + uStack_20;
      }
    }
    else {
      uStack_20 = uStack_20 + 1;
    }
  }
  return uStack_20;
}

Assistant:

uint64_t HELPER(macmulf)(CPUM68KState *env, uint32_t op1, uint32_t op2)
{
    uint64_t product;
    uint32_t remainder;

    product = (uint64_t)op1 * op2;
    if (env->macsr & MACSR_RT) {
        remainder = product & 0xffffff;
        product >>= 24;
        if (remainder > 0x800000)
            product++;
        else if (remainder == 0x800000)
            product += (product & 1);
    } else {
        product >>= 24;
    }
    return product;
}